

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<VCProjectSingleConfig>::emplace<VCProjectSingleConfig_const&>
          (QMovableArrayOps<VCProjectSingleConfig> *this,qsizetype i,VCProjectSingleConfig *args)

{
  VCProjectSingleConfig **ppVVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_3a68;
  VCProjectSingleConfig tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<VCProjectSingleConfig>).
           super_QArrayDataPointer<VCProjectSingleConfig>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<VCProjectSingleConfig>).
        super_QArrayDataPointer<VCProjectSingleConfig>.size == i) {
      qVar5 = QArrayDataPointer<VCProjectSingleConfig>::freeSpaceAtEnd
                        ((QArrayDataPointer<VCProjectSingleConfig> *)this);
      if (qVar5 == 0) goto LAB_001ae048;
      VCProjectSingleConfig::VCProjectSingleConfig
                ((this->super_QGenericArrayOps<VCProjectSingleConfig>).
                 super_QArrayDataPointer<VCProjectSingleConfig>.ptr +
                 (this->super_QGenericArrayOps<VCProjectSingleConfig>).
                 super_QArrayDataPointer<VCProjectSingleConfig>.size,args);
LAB_001ae14d:
      pqVar2 = &(this->super_QGenericArrayOps<VCProjectSingleConfig>).
                super_QArrayDataPointer<VCProjectSingleConfig>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_001ae0ff;
    }
LAB_001ae048:
    if (i == 0) {
      qVar5 = QArrayDataPointer<VCProjectSingleConfig>::freeSpaceAtBegin
                        ((QArrayDataPointer<VCProjectSingleConfig> *)this);
      if (qVar5 != 0) {
        VCProjectSingleConfig::VCProjectSingleConfig
                  ((this->super_QGenericArrayOps<VCProjectSingleConfig>).
                   super_QArrayDataPointer<VCProjectSingleConfig>.ptr + -1,args);
        ppVVar1 = &(this->super_QGenericArrayOps<VCProjectSingleConfig>).
                   super_QArrayDataPointer<VCProjectSingleConfig>.ptr;
        *ppVVar1 = *ppVVar1 + -1;
        goto LAB_001ae14d;
      }
    }
  }
  memset(&tmp,0xaa,0x3a10);
  VCProjectSingleConfig::VCProjectSingleConfig(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<VCProjectSingleConfig>).
          super_QArrayDataPointer<VCProjectSingleConfig>.size != 0;
  QArrayDataPointer<VCProjectSingleConfig>::detachAndGrow
            ((QArrayDataPointer<VCProjectSingleConfig> *)this,(uint)(i == 0 && bVar6),1,
             (VCProjectSingleConfig **)0x0,(QArrayDataPointer<VCProjectSingleConfig> *)0x0);
  if (i == 0 && bVar6) {
    VCProjectSingleConfig::VCProjectSingleConfig
              ((this->super_QGenericArrayOps<VCProjectSingleConfig>).
               super_QArrayDataPointer<VCProjectSingleConfig>.ptr + -1,&tmp);
    ppVVar1 = &(this->super_QGenericArrayOps<VCProjectSingleConfig>).
               super_QArrayDataPointer<VCProjectSingleConfig>.ptr;
    *ppVVar1 = *ppVVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<VCProjectSingleConfig>).
              super_QArrayDataPointer<VCProjectSingleConfig>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_3a68,(QArrayDataPointer<VCProjectSingleConfig> *)this,i,1);
    VCProjectSingleConfig::VCProjectSingleConfig(local_3a68.displaceFrom,&tmp);
    local_3a68.displaceFrom = local_3a68.displaceFrom + 1;
    (local_3a68.data)->size = (local_3a68.data)->size + local_3a68.nInserts;
  }
  VCProjectSingleConfig::~VCProjectSingleConfig(&tmp);
LAB_001ae0ff:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }